

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void preprocess_upvalues(Proc *proc)

{
  undefined1 local_30 [8];
  PtrListIterator child_prociter__;
  Proc *child_proc;
  Proc *proc_local;
  
  compute_upvalue_attributes(proc);
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_30,(PtrList *)proc->procs);
  child_prociter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_30);
  while (child_prociter__._16_8_ != 0) {
    preprocess_upvalues((Proc *)child_prociter__._16_8_);
    child_prociter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_30);
  }
  return;
}

Assistant:

static void preprocess_upvalues(Proc *proc)
{
	compute_upvalue_attributes(proc);
	Proc *child_proc;
	FOR_EACH_PTR(proc->procs, Proc, child_proc) { preprocess_upvalues(child_proc); }
	END_FOR_EACH_PTR(childproc)
}